

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int voc_check_special(voccxdef *ctx,char *wrd,int checktyp)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  vocspdef *x;
  int wrdlen;
  int len;
  char typ;
  char *endp;
  char *p;
  vocspdef *local_48;
  char *local_28;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    for (local_48 = vocsptab; local_48->vocspin != (char *)0x0; local_48 = local_48 + 1) {
      if ((local_48->vocspout == in_EDX) &&
         (iVar1 = strncmp(in_RSI,local_48->vocspin,6), iVar1 == 0)) {
        return 1;
      }
    }
  }
  else {
    sVar3 = strlen(in_RSI);
    local_28 = *(char **)(in_RDI + 0x48);
    pcVar4 = local_28 + *(int *)(in_RDI + 0x50);
    for (; local_28 < pcVar4; local_28 = local_28 + 2 + iVar1) {
      iVar1 = (int)local_28[1];
      if (((*local_28 == in_EDX) && (iVar1 == (int)sVar3)) &&
         (iVar2 = memcmp(local_28 + 2,in_RSI,(long)iVar1), iVar2 == 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int voc_check_special(voccxdef *ctx, char *wrd, int checktyp)
{
    /* search the user or built-in special table, as appropriate */
    if (ctx->voccxspp)
    {
        char  *p;
        char  *endp;
        char   typ;
        int    len;
        int    wrdlen = strlen((char *)wrd);
        
        for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
             p < endp ; )
        {
            typ = *p++;
            len = *p++;

            /* if this word matches in type and text, we have a match */
            if (typ == checktyp
                && len == wrdlen && !memcmp(p, wrd, (size_t)len))
                return TRUE;

            /* no match - keep going */
            p += len;
        }
    }
    else
    {
        vocspdef *x;
        
        for (x = vocsptab ; x->vocspin ; ++x)
        {
            /* if it matches in type and text, we have a match */
            if (x->vocspout == checktyp
                && !strncmp((char *)wrd, x->vocspin, (size_t)6))
                return TRUE;
        }
    }

    /* didn't find a match for the text and type */
    return FALSE;
}